

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void srcarg_matrix_replicate(Context *ctx,int idx,int rows)

{
  RegisterType RVar1;
  VariableList *pVVar2;
  int iVar3;
  SourceMod SVar4;
  int iVar5;
  RegisterType RVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  SourceArgInfo *pSVar15;
  
  if (1 < idx) {
    pSVar15 = ctx->source_args + 2;
    iVar14 = 1;
    do {
      iVar13 = ctx->source_args[1].regnum;
      iVar3 = ctx->source_args[1].swizzle;
      iVar9 = ctx->source_args[1].swizzle_x;
      iVar10 = ctx->source_args[1].swizzle_y;
      iVar11 = ctx->source_args[1].swizzle_z;
      iVar12 = ctx->source_args[1].swizzle_w;
      SVar4 = ctx->source_args[1].src_mod;
      RVar1 = ctx->source_args[1].regtype;
      iVar5 = ctx->source_args[1].relative;
      RVar6 = ctx->source_args[1].relative_regtype;
      iVar7 = ctx->source_args[1].relative_regnum;
      iVar8 = ctx->source_args[1].relative_component;
      pVVar2 = ctx->source_args[1].relative_array;
      pSVar15->token = ctx->source_args[1].token;
      pSVar15->regnum = iVar13;
      pSVar15->swizzle = iVar3;
      pSVar15->src_mod = SVar4;
      pSVar15->regtype = RVar1;
      pSVar15->relative = iVar5;
      pSVar15->relative_regtype = RVar6;
      pSVar15->relative_regnum = iVar7;
      pSVar15->relative_component = iVar8;
      pSVar15->relative_array = pVVar2;
      pSVar15->swizzle_x = iVar9;
      pSVar15->swizzle_y = iVar10;
      pSVar15->swizzle_z = iVar11;
      pSVar15->swizzle_w = iVar12;
      iVar13 = pSVar15->regnum + iVar14;
      pSVar15->regnum = iVar13;
      RVar1 = pSVar15->regtype;
      if (0 < iVar13 && RVar1 == REG_TYPE_COLOROUT) {
        ctx->have_multi_color_outputs = 1;
      }
      reglist_insert(ctx,&ctx->used_registers,RVar1,iVar13);
      pSVar15 = pSVar15 + 1;
      iVar14 = iVar14 + 1;
    } while (idx != iVar14);
  }
  return;
}

Assistant:

static void srcarg_matrix_replicate(Context *ctx, const int idx,
                                       const int rows)
{
    int i;
    SourceArgInfo *src = &ctx->source_args[idx];
    SourceArgInfo *dst = &ctx->source_args[idx+1];
    for (i = 0; i < (rows-1); i++, dst++)
    {
        memcpy(dst, src, sizeof (SourceArgInfo));
        dst->regnum += (i + 1);
        set_used_register(ctx, dst->regtype, dst->regnum, 0);
    } // for
}